

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManEquivCountOne(Gia_Man_t *p,int i)

{
  int iVar1;
  int local_1c;
  int local_18;
  int nLits;
  int Ent;
  int i_local;
  Gia_Man_t *p_local;
  
  local_1c = 1;
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x1c0,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
  }
  local_18 = Gia_ObjNext(p,i);
  while( true ) {
    if (local_18 < 1) {
      return local_1c;
    }
    iVar1 = Gia_ObjRepr(p,local_18);
    if (iVar1 != i) break;
    local_1c = local_1c + 1;
    local_18 = Gia_ObjNext(p,local_18);
  }
  __assert_fail("Gia_ObjRepr(p, Ent) == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x1c2,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManEquivCountOne( Gia_Man_t * p, int i )
{
    int Ent, nLits = 1;
    Gia_ClassForEachObj1( p, i, Ent )
    {
        assert( Gia_ObjRepr(p, Ent) == i );
        nLits++;
    }
    return nLits;
}